

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O0

unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>
bssl::CreateCertErrorParams1Der(char *name,Input der)

{
  Input local_48;
  Input local_38;
  uchar *local_28;
  char *name_local;
  Input der_local;
  
  name_local = (char *)der.data_.size_;
  local_28 = der.data_.data_;
  der_local.data_.size_ = (size_t)name;
  if (local_28 == (uchar *)0x0) {
    abort();
  }
  local_38.data_.data_ = (uchar *)0x0;
  memset(&local_48,0,0x10);
  bssl::der::Input::Input(&local_48);
  ::std::
  make_unique<bssl::(anonymous_namespace)::CertErrorParams2Der,char_const*&,bssl::der::Input&,decltype(nullptr),bssl::der::Input>
            ((char **)&local_38.data_.size_,(Input *)&stack0xffffffffffffffd8,&name_local,&local_38)
  ;
  ::std::unique_ptr<bssl::CertErrorParams,std::default_delete<bssl::CertErrorParams>>::
  unique_ptr<bssl::(anonymous_namespace)::CertErrorParams2Der,std::default_delete<bssl::(anonymous_namespace)::CertErrorParams2Der>,void>
            ((unique_ptr<bssl::CertErrorParams,std::default_delete<bssl::CertErrorParams>> *)name,
             (unique_ptr<bssl::(anonymous_namespace)::CertErrorParams2Der,_std::default_delete<bssl::(anonymous_namespace)::CertErrorParams2Der>_>
              *)&local_38.data_.size_);
  ::std::
  unique_ptr<bssl::(anonymous_namespace)::CertErrorParams2Der,_std::default_delete<bssl::(anonymous_namespace)::CertErrorParams2Der>_>
  ::~unique_ptr((unique_ptr<bssl::(anonymous_namespace)::CertErrorParams2Der,_std::default_delete<bssl::(anonymous_namespace)::CertErrorParams2Der>_>
                 *)&local_38.data_.size_);
  return (__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
          )(__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
            )name;
}

Assistant:

std::unique_ptr<CertErrorParams> CreateCertErrorParams1Der(const char *name,
                                                           der::Input der) {
  BSSL_CHECK(name);
  return std::make_unique<CertErrorParams2Der>(name, der, nullptr,
                                               der::Input());
}